

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O3

void __thiscall cppcms::rpc::json_call::check_not_notification(json_call *this)

{
  call_error *this_00;
  string local_40;
  
  if (this->notification_ != true) {
    return;
  }
  this_00 = (call_error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Notification method should not return response","");
  call_error::call_error(this_00,&local_40);
  __cxa_throw(this_00,&call_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void json_call::check_not_notification()
	{
		if(notification())
			throw call_error("Notification method should not return response");
	}